

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_passMip(void *highs,HighsInt num_col,HighsInt num_row,HighsInt num_nz,
                      HighsInt a_format,HighsInt sense,double offset,double *col_cost,
                      double *col_lower,double *col_upper,double *row_lower,double *row_upper,
                      HighsInt *a_start,HighsInt *a_index,double *a_value,HighsInt *integrality)

{
  HighsStatus HVar1;
  double unaff_RBX;
  undefined8 unaff_R12;
  undefined8 unaff_R13;
  undefined8 unaff_R14;
  Highs *unaff_R15;
  double *in_stack_00000030;
  double *in_stack_00000038;
  double *in_stack_00000040;
  double *in_stack_00000048;
  undefined4 in_stack_00000058;
  
  HVar1 = Highs::passModel(unaff_R15,(HighsInt)((ulong)unaff_R14 >> 0x20),(HighsInt)unaff_R14,
                           (HighsInt)((ulong)unaff_R13 >> 0x20),(HighsInt)unaff_R13,
                           (HighsInt)((ulong)unaff_R12 >> 0x20),unaff_RBX,in_stack_00000030,
                           in_stack_00000038,in_stack_00000040,in_stack_00000048,(double *)offset,
                           (HighsInt *)CONCAT44(sense,in_stack_00000058),
                           (HighsInt *)CONCAT44(num_nz,a_format),(double *)CONCAT44(num_col,num_row)
                           ,(HighsInt *)highs);
  return HVar1;
}

Assistant:

HighsInt Highs_passMip(void* highs, const HighsInt num_col,
                       const HighsInt num_row, const HighsInt num_nz,
                       const HighsInt a_format, const HighsInt sense,
                       const double offset, const double* col_cost,
                       const double* col_lower, const double* col_upper,
                       const double* row_lower, const double* row_upper,
                       const HighsInt* a_start, const HighsInt* a_index,
                       const double* a_value, const HighsInt* integrality) {
  return (HighsInt)((Highs*)highs)
      ->passModel(num_col, num_row, num_nz, a_format, sense, offset, col_cost,
                  col_lower, col_upper, row_lower, row_upper, a_start, a_index,
                  a_value, integrality);
}